

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O2

void license::test::create_project
               (path *projects_folder,path *expectedPrivateKey,path *expected_public_key,
               path *mock_source_folder,string *project_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int result;
  undefined1 local_238 [8];
  undefined8 local_230;
  shared_count sStack_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  string projects_str;
  undefined **local_1f8;
  ulong local_1f0;
  shared_count sStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string mock_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *argv1 [9];
  
  local_220 = &expected_public_key->m_pathname;
  boost::filesystem::remove_all(projects_folder);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x21);
  bVar2 = boost::filesystem::exists(expectedPrivateKey);
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_1_ = !bVar2;
  std::operator+(&projects_str,"Private key ",&expectedPrivateKey->m_pathname);
  std::operator+(&mock_source,&projects_str," can\'t be deleted.");
  argv1[1] = (char *)((ulong)argv1[1] & 0xffffffffffffff00);
  argv1[0] = (char *)&PTR__lazy_ostream_005be540;
  argv1[2] = boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_a0 = "";
  argv1[3] = (char *)&mock_source;
  boost::test_tools::tt_detail::report_assertion(&local_1f8,argv1,&local_a8,0x21,1,1,0);
  std::__cxx11::string::~string((string *)&mock_source);
  std::__cxx11::string::~string((string *)&projects_str);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x23);
  pbVar1 = local_220;
  bVar2 = boost::filesystem::exists((path *)local_220);
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,!bVar2);
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  std::operator+(&projects_str,"Public key ",pbVar1);
  std::operator+(&mock_source,&projects_str," can\'t be deleted.");
  argv1[1] = (char *)((ulong)argv1[1] & 0xffffffffffffff00);
  argv1[0] = (char *)&PTR__lazy_ostream_005be540;
  argv1[2] = boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_d0 = "";
  argv1[3] = (char *)&mock_source;
  boost::test_tools::tt_detail::report_assertion(&local_1f8,argv1,&local_d8,0x23,1,1,0);
  std::__cxx11::string::~string((string *)&mock_source);
  std::__cxx11::string::~string((string *)&projects_str);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  std::__cxx11::string::string((string *)&mock_source,(string *)mock_source_folder);
  std::__cxx11::string::string((string *)&projects_str,(string *)projects_folder);
  argv1[0] = "lcc";
  argv1[1] = "project";
  argv1[2] = "init";
  argv1[3] = "-n";
  argv1[4] = (project_name->_M_dataplus)._M_p;
  argv1[5] = "--projects-folder";
  argv1[6] = projects_str._M_dataplus._M_p;
  argv1[7] = "--templates";
  argv1[8] = mock_source._M_dataplus._M_p;
  result = CommandLineParser::parseCommandLine(9,argv1);
  pbVar1 = local_220;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x32);
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_005be590;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x49a5b7;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_100 = "";
  local_188._M_dataplus._M_p._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1f8,&local_108,0x32,1,2,&result,"result",&local_188,"0");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x33);
  local_238[0] = boost::filesystem::exists(expectedPrivateKey);
  local_230 = 0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  std::operator+(&local_1a8,"Private key ",&expectedPrivateKey->m_pathname);
  std::operator+(&local_188,&local_1a8," created.");
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_005be540;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_130 = "";
  local_1e0 = &local_188;
  boost::test_tools::tt_detail::report_assertion(local_238,&local_1f8,&local_138,0x33,2,1,0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  boost::detail::shared_count::~shared_count(&sStack_228);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x34);
  local_238[0] = boost::filesystem::exists((path *)pbVar1);
  local_230 = 0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  std::operator+(&local_1a8,"Public key ",pbVar1);
  std::operator+(&local_188,&local_1a8," created.");
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_005be540;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/command-line_test.cpp"
  ;
  local_160 = "";
  local_1e0 = &local_188;
  boost::test_tools::tt_detail::report_assertion(local_238,&local_1f8,&local_168,0x34,1,1,0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  boost::detail::shared_count::~shared_count(&sStack_228);
  std::__cxx11::string::~string((string *)&projects_str);
  std::__cxx11::string::~string((string *)&mock_source);
  return;
}

Assistant:

static void create_project(const fs::path& projects_folder, const fs::path& expectedPrivateKey,
						   const fs::path& expected_public_key, const fs::path& mock_source_folder,
						   const string& project_name) {
	fs::remove_all(projects_folder);
	BOOST_CHECK_MESSAGE(!fs::exists(expectedPrivateKey),
						"Private key " + expectedPrivateKey.string() + " can't be deleted.");
	BOOST_CHECK_MESSAGE(!fs::exists(expected_public_key),
						"Public key " + expected_public_key.string() + " can't be deleted.");
	const string mock_source = mock_source_folder.string();
	const string projects_str = projects_folder.string();
	int argc = 9;
	const char* argv1[] = {"lcc",
						   "project",
						   "init",
						   "-n",
						   project_name.c_str(),
						   "--projects-folder",
						   projects_str.c_str(),
						   "--templates",
						   mock_source.c_str()};
	// initialize_project
	int result = CommandLineParser::parseCommandLine(argc, argv1);
	BOOST_CHECK_EQUAL(result, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(expectedPrivateKey), "Private key " + expectedPrivateKey.string() + " created.");
	BOOST_CHECK_MESSAGE(fs::exists(expected_public_key), "Public key " + expected_public_key.string() + " created.");
}